

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O0

void __thiscall interpreter::Interpreter::Run(Interpreter *this,string *data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *out;
  element_type *this_00;
  basic_ostream<char,_std::char_traits<char>_> local_69;
  undefined1 local_68 [8];
  shared_ptr<runtime::VirtualMachine> runtime;
  shared_ptr<ScriptAstNode> local_48;
  undefined1 local_38 [8];
  shared_ptr<bytecode::CompiledFile> compiledFile;
  shared_ptr<ScriptAstNode> script;
  string *data_local;
  Interpreter *this_local;
  
  out = &compiledFile.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount;
  parseScript((ostream *)out,(string *)this->out);
  std::shared_ptr<ScriptAstNode>::shared_ptr(&local_48,(shared_ptr<ScriptAstNode> *)out);
  compile((shared_ptr<ScriptAstNode> *)local_38);
  std::shared_ptr<ScriptAstNode>::~shared_ptr(&local_48);
  local_69 = (basic_ostream<char,_std::char_traits<char>_>)0x0;
  std::
  make_shared<runtime::VirtualMachine,bool,std::ostream&,std::istream&,std::shared_ptr<bytecode::CompiledFile>>
            ((bool *)local_68,&local_69,(basic_istream<char,_std::char_traits<char>_> *)this->out,
             (shared_ptr<bytecode::CompiledFile> *)this->in);
  this_00 = std::
            __shared_ptr_access<runtime::VirtualMachine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<runtime::VirtualMachine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_68);
  ::runtime::VirtualMachine::run(this_00);
  std::shared_ptr<runtime::VirtualMachine>::~shared_ptr
            ((shared_ptr<runtime::VirtualMachine> *)local_68);
  std::shared_ptr<bytecode::CompiledFile>::~shared_ptr
            ((shared_ptr<bytecode::CompiledFile> *)local_38);
  std::shared_ptr<ScriptAstNode>::~shared_ptr
            ((shared_ptr<ScriptAstNode> *)
             &compiledFile.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void interpreter::Interpreter::Run(const std::string & data) {

  std::shared_ptr<ScriptAstNode> script = parseScript(this->out, data);
  auto compiledFile = compile(script);
  auto runtime = std::make_shared<runtime::VirtualMachine>(false, this->out, this->in, std::move(compiledFile));
  runtime->run();
}